

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int axset_compare(void *a,void *b)

{
  int iVar1;
  axset *p2;
  axset *p1;
  
  iVar1 = *(int *)((long)b + 0xc) - *(int *)((long)a + 0xc);
  if (iVar1 == 0) {
    iVar1 = *(int *)((long)a + 0x10) - *(int *)((long)b + 0x10);
    if (a != b && iVar1 == 0) {
      __assert_fail("c!=0 || p1==p2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                    ,0xf81,"int axset_compare(const void *, const void *)");
    }
  }
  return iVar1;
}

Assistant:

static int axset_compare(const void *a, const void *b){
  struct axset *p1 = (struct axset*)a;
  struct axset *p2 = (struct axset*)b;
  int c;
  c = p2->nAction - p1->nAction;
  if( c==0 ){
    c = p1->iOrder - p2->iOrder;
  }
  assert( c!=0 || p1==p2 );
  return c;
}